

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

ServiceOptions * __thiscall
google::protobuf::ServiceDescriptorProto::mutable_options(ServiceDescriptorProto *this)

{
  ServiceOptions *this_00;
  ServiceDescriptorProto *this_local;
  
  set_has_options(this);
  if (this->options_ == (ServiceOptions *)0x0) {
    this_00 = (ServiceOptions *)operator_new(0x60);
    ServiceOptions::ServiceOptions(this_00);
    this->options_ = this_00;
  }
  return this->options_;
}

Assistant:

inline ::google::protobuf::ServiceOptions* ServiceDescriptorProto::mutable_options() {
  set_has_options();
  if (options_ == NULL) options_ = new ::google::protobuf::ServiceOptions;
  return options_;
}